

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Extend_impl
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it,SnapshotDataType t)

{
  pointer *ppSVar1;
  iterator __position;
  iterator __position_00;
  ulong uVar2;
  iterator iVar3;
  ulong local_10;
  
  local_10 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar2 != ((long)(this->Data).
                      super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x99,
                  "iterator cmLinkedTree<cmState::SnapshotDataType>::Extend_impl(iterator, T) [T = cmState::SnapshotDataType]"
                 );
  }
  if (local_10 <= uVar2) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    __position_00._M_current =
         (this->Data).
         super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmState::SnapshotDataType,std::allocator<cmState::SnapshotDataType>>::
      _M_realloc_insert<cmState::SnapshotDataType_const&>
                ((vector<cmState::SnapshotDataType,std::allocator<cmState::SnapshotDataType>> *)this
                 ,__position_00,&t);
    }
    else {
      ((__position_00._M_current)->BuildSystemDirectory).Position = t.BuildSystemDirectory.Position;
      (__position_00._M_current)->SnapshotType = t.SnapshotType;
      *(undefined4 *)&(__position_00._M_current)->field_0x14 = t._20_4_;
      ((__position_00._M_current)->BuildSystemDirectory).Tree = t.BuildSystemDirectory.Tree;
      ((__position_00._M_current)->DirectoryParent).Tree = t.DirectoryParent.Tree;
      ((__position_00._M_current)->DirectoryParent).Position = t.DirectoryParent.Position;
      ppSVar1 = &(this->Data).
                 super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    iVar3.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar3.Tree = this;
    return iVar3;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                ,0x9a,
                "iterator cmLinkedTree<cmState::SnapshotDataType>::Extend_impl(iterator, T) [T = cmState::SnapshotDataType]"
               );
}

Assistant:

iterator Extend_impl(iterator it, T t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(t);
    return iterator(this, this->UpPositions.size());
  }